

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg4.hpp
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,mrg4 *R)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  long lVar3;
  parameter_type P_new;
  status_type S_new;
  delim_c local_6c;
  delim_c local_6b;
  delim_c local_6a;
  delim_c local_69;
  mrg4 *local_68;
  delim_str local_60;
  mrg_parameter<int,_4,_trng::mrg4> local_58;
  mrg_status<int,_4,_trng::mrg4> local_40;
  
  local_58.a[0] = 0;
  local_58.a[1] = 0;
  local_58.a[2] = 0;
  local_58.a[3] = 0;
  local_68 = R;
  mrg_status<int,_4,_trng::mrg4>::mrg_status(&local_40);
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  utility::operator>>(in,(ignore_spaces_cl *)&local_60);
  local_69.c = '[';
  pbVar2 = utility::operator>>(in,&local_69);
  local_60.str = mrg4::name();
  pbVar2 = utility::operator>>(pbVar2,&local_60);
  local_6a.c = ' ';
  pbVar2 = utility::operator>>(pbVar2,&local_6a);
  pbVar2 = operator>>(pbVar2,&local_58);
  local_6b.c = ' ';
  pbVar2 = utility::operator>>(pbVar2,&local_6b);
  pbVar2 = operator>>(pbVar2,&local_40);
  local_6c.c = ']';
  utility::operator>>(pbVar2,&local_6c);
  lVar3 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar3 + 0x20] & 5) == 0) {
    *(undefined8 *)(local_68->P).a = local_58.a._0_8_;
    *(undefined8 *)((local_68->P).a + 2) = local_58.a._8_8_;
    *(undefined8 *)(local_68->S).r = local_40.r._0_8_;
    *(undefined8 *)((local_68->S).r + 2) = local_40.r._8_8_;
    lVar3 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar3 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg4 &R) {
      mrg4::parameter_type P_new;
      mrg4::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(mrg4::name()) >> utility::delim(' ') >>
          P_new >> utility::delim(' ') >> S_new >> utility::delim(']');
      if (in) {
        R.P = P_new;
        R.S = S_new;
      }
      in.flags(flags);
      return in;
    }